

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLText::ShallowEqual(XMLText *this,XMLNode *compare)

{
  long lVar1;
  char *p;
  char *q;
  long *in_RSI;
  XMLText *text;
  XMLNode *in_stack_ffffffffffffffc8;
  undefined1 local_19;
  
  lVar1 = (**(code **)(*in_RSI + 0x38))();
  local_19 = false;
  if (lVar1 != 0) {
    p = XMLNode::Value(in_stack_ffffffffffffffc8);
    q = XMLNode::Value(in_stack_ffffffffffffffc8);
    local_19 = XMLUtil::StringEqual(p,q,0x7fffffff);
  }
  return local_19;
}

Assistant:

bool XMLText::ShallowEqual( const XMLNode* compare ) const
{
    const XMLText* text = compare->ToText();
    return ( text && XMLUtil::StringEqual( text->Value(), Value() ) );
}